

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O2

int noise_segment_mix(mixed_segment *segment)

{
  float fVar1;
  undefined8 *puVar2;
  code *pcVar3;
  uint32_t i;
  ulong uVar4;
  float fVar5;
  uint32_t samples;
  float *out;
  
  puVar2 = (undefined8 *)segment->data;
  pcVar3 = (code *)puVar2[1];
  fVar1 = *(float *)(puVar2 + 2);
  samples = 0xffffffff;
  mixed_buffer_request_write(&out,&samples,(mixed_buffer *)*puVar2);
  for (uVar4 = 0; uVar4 < samples; uVar4 = uVar4 + 1) {
    fVar5 = (float)(*pcVar3)(puVar2);
    out[uVar4] = fVar5 * fVar1;
  }
  mixed_buffer_finish_write(samples,(mixed_buffer *)*puVar2);
  return 1;
}

Assistant:

int noise_segment_mix(struct mixed_segment *segment){
  struct noise_segment_data *data = (struct noise_segment_data *)segment->data;

  float (*noise)(struct noise_segment_data *data) = data->type;
  float volume = data->volume;
  float *restrict out;
  uint32_t samples = UINT32_MAX;
  mixed_buffer_request_write(&out, &samples, data->out);
  for(uint32_t i=0; i<samples; ++i){
    out[i] = noise(data) * volume;
  }
  mixed_buffer_finish_write(samples, data->out);
  return 1;
}